

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__write_int(int fd,int val)

{
  ssize_t sVar1;
  int *piVar2;
  undefined1 local_14 [4];
  
  do {
    sVar1 = write(fd,local_14,4);
    if (sVar1 != -1) {
      if (sVar1 == 4) {
        return;
      }
      goto LAB_00114e54;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*piVar2 == 0x20) {
    return;
  }
LAB_00114e54:
  __assert_fail("n == sizeof(val)",
                "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/process.c"
                ,0x10d,"void uv__write_int(int, int)");
}

Assistant:

static void uv__write_int(int fd, int val) {
  ssize_t n;

  do
    n = write(fd, &val, sizeof(val));
  while (n == -1 && errno == EINTR);

  if (n == -1 && errno == EPIPE)
    return; /* parent process has quit */

  assert(n == sizeof(val));
}